

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wildmidi_lib.cpp
# Opt level: O2

void load_patch(_mdi *mdi,unsigned_short patchid)

{
  _sample **pp_Var1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  ushort uVar5;
  unsigned_short uVar6;
  unsigned_long uVar7;
  float fVar8;
  ushort uVar9;
  short sVar10;
  _patch *p_Var11;
  _sample *p_Var12;
  _sample *p_Var13;
  _patch **pp_Var14;
  uint uVar15;
  ushort uVar16;
  long lVar17;
  byte bVar18;
  int iVar19;
  uint uVar20;
  ushort uVar21;
  uchar *puVar22;
  ushort uVar23;
  ulong uVar24;
  bool bVar25;
  
  uVar15 = 0;
  while (uVar24 = (ulong)uVar15, uVar24 < mdi->patch_count) {
    uVar15 = uVar15 + 1;
    if (mdi->patches[uVar24]->patchid == patchid) {
      return;
    }
  }
  p_Var11 = get_patch_data(patchid);
  if (p_Var11 == (_patch *)0x0) {
    return;
  }
  FCriticalSection::Enter(&patch_lock);
  if (p_Var11->loaded == '\0') {
    p_Var11->loaded = '\x01';
    p_Var12 = _WM_load_gus_pat(p_Var11->filename,(uint)fix_release);
    if (p_Var12 == (_sample *)0x0) goto LAB_003625e4;
    if (auto_amp == '\x01') {
      uVar9 = 0;
      uVar16 = 0;
      p_Var13 = p_Var12;
      do {
        uVar21 = 0;
        uVar23 = 0;
        for (uVar24 = 0; p_Var13->data_length >> 10 != uVar24; uVar24 = uVar24 + 1) {
          uVar5 = p_Var13->data[uVar24];
          if ((short)uVar21 < (short)uVar5) {
            uVar21 = uVar5;
          }
          if ((short)uVar23 <= (short)uVar5) {
            uVar5 = uVar23;
          }
          uVar23 = uVar5;
        }
        if ((short)uVar9 < (short)uVar21) {
          uVar9 = uVar21;
        }
        if ((short)uVar23 < (short)uVar16) {
          uVar16 = uVar23;
        }
        p_Var13 = p_Var13->next;
      } while (p_Var13 != (_sample *)0x0);
      iVar19 = (int)(short)uVar16;
      uVar20 = -iVar19;
      uVar15 = (uint)uVar9;
      if (auto_amp_with_amp == '\x01') {
        if (SBORROW4(uVar15,uVar20) == (int)(uVar15 + iVar19) < 0) {
          iVar19 = (int)(0x1fffc00 / (ulong)uVar9);
        }
        else {
          iVar19 = (int)(0x2000000 / (ulong)uVar20);
        }
        sVar10 = (short)((uint)(iVar19 * p_Var11->amp) >> 10);
      }
      else if (SBORROW4(uVar15,uVar20) == (int)(uVar15 + iVar19) < 0) {
        sVar10 = (short)(0x1fffc00 / (ulong)uVar9);
      }
      else {
        sVar10 = (short)(0x2000000 / (ulong)uVar20);
      }
      p_Var11->amp = sVar10;
    }
    p_Var11->first_sample = p_Var12;
    uVar6 = p_Var11->patchid;
    if ((char)uVar6 < '\0') {
      bVar2 = p_Var11->keep;
      p_Var13 = p_Var12;
      if ((bVar2 & 4) == 0) {
        do {
          p_Var13->modes = p_Var13->modes & 0xfb;
          pp_Var1 = &p_Var13->next;
          p_Var13 = *pp_Var1;
        } while (*pp_Var1 != (_sample *)0x0);
      }
      p_Var13 = p_Var12;
      if ((bVar2 & 0x40) == 0) {
        do {
          p_Var13->modes = p_Var13->modes & 0xbf;
          pp_Var1 = &p_Var13->next;
          p_Var13 = *pp_Var1;
        } while (*pp_Var1 != (_sample *)0x0);
      }
    }
    p_Var13 = p_Var12;
    if (uVar6 == 0x2f) {
      do {
        if ((p_Var13->modes & 4) == 0) {
          for (lVar17 = 0; lVar17 != 3; lVar17 = lVar17 + 1) {
            p_Var13->env_target[lVar17 + 3] = p_Var13->env_target[2];
            p_Var13->env_rate[lVar17 + 3] = p_Var13->env_rate[2];
          }
        }
        pp_Var1 = &p_Var13->next;
        p_Var13 = *pp_Var1;
      } while (*pp_Var1 != (_sample *)0x0);
    }
    uVar20 = (uint)_WM_SampleRate;
    bVar2 = p_Var11->keep;
    uVar15 = (uint)_WM_SampleRate;
    bVar3 = p_Var11->remove;
    do {
      if (((bVar3 & 0x20) != 0) && ((p_Var12->modes & 0x20) != 0)) {
        p_Var12->modes = p_Var12->modes & 0xdf;
      }
      bVar18 = p_Var12->modes;
      if (((char)bVar3 < '\0') && ((char)bVar18 < '\0')) {
        bVar18 = bVar18 & 0x7f;
        p_Var12->modes = bVar18;
      }
      bVar25 = (bVar2 & 0x40) != 0;
      if (bVar25) {
        p_Var12->modes = bVar18 | 0x40;
      }
      puVar22 = &p_Var11->env[0].set;
      for (lVar17 = 0; lVar17 != 6; lVar17 = lVar17 + 1) {
        if (bVar25 || (bVar18 & 0x40) != 0) {
          bVar4 = *puVar22;
          if ((bVar4 & 2) != 0) {
            p_Var12->env_target[lVar17] = (int)(long)(*(float *)(puVar22 + -4) * 255.0) * 0x4040;
          }
          if ((bVar4 & 1) != 0) {
            fVar8 = ((_env *)(puVar22 + -8))->time * (float)uVar20 * 0.001;
            goto LAB_0036257f;
          }
        }
        else {
          p_Var12->env_target[lVar17] = 0x3fffff;
          fVar8 = (float)uVar15 * 0.001456;
LAB_0036257f:
          p_Var12->env_rate[lVar17] = (int)(long)(4194303.0 / fVar8);
        }
        puVar22 = puVar22 + 0xc;
      }
      p_Var12 = p_Var12->next;
    } while (p_Var12 != (_sample *)0x0);
  }
  else if (p_Var11->first_sample == (_sample *)0x0) goto LAB_003625e4;
  uVar7 = mdi->patch_count;
  mdi->patch_count = uVar7 + 1;
  pp_Var14 = (_patch **)realloc(mdi->patches,uVar7 * 8 + 8);
  mdi->patches = pp_Var14;
  pp_Var14[mdi->patch_count - 1] = p_Var11;
  p_Var11->inuse_count = p_Var11->inuse_count + 1;
LAB_003625e4:
  FCriticalSection::Leave(&patch_lock);
  return;
}

Assistant:

static void load_patch(struct _mdi *mdi, unsigned short patchid) {
	unsigned int i;
	struct _patch *tmp_patch = NULL;

	for (i = 0; i < mdi->patch_count; i++) {
		if (mdi->patches[i]->patchid == patchid) {
			return;
		}
	}

	tmp_patch = get_patch_data(patchid);
	if (tmp_patch == NULL) {
		return;
	}

	patch_lock.Enter();
	if (!tmp_patch->loaded) {
		if (load_sample(tmp_patch) == -1) {
			patch_lock.Leave();
			return;
		}
	}

	if (tmp_patch->first_sample == NULL) {
		patch_lock.Leave();
		return;
	}

	mdi->patch_count++;
	mdi->patches = (struct _patch**)realloc(mdi->patches,
			(sizeof(struct _patch*) * mdi->patch_count));
	mdi->patches[mdi->patch_count - 1] = tmp_patch;
	tmp_patch->inuse_count++;
	patch_lock.Leave();
}